

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

void __thiscall
efsw::FileWatcherInotify::removeWatchLocked(FileWatcherInotify *this,WatchID watchid)

{
  _Rb_tree_header *p_Var1;
  WatcherInotify *parent;
  bool bVar2;
  iterator iVar3;
  _Rb_tree_node_base *p_Var4;
  const_iterator __position;
  pointer plVar5;
  vector<long,_std::allocator<long>_> eraseWatches;
  _Vector_base<long,_std::allocator<long>_> local_58;
  WatchID local_38;
  
  local_38 = watchid;
  iVar3 = std::
          _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
          ::find(&(this->mWatches)._M_t,&local_38);
  p_Var1 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    parent = (WatcherInotify *)iVar3._M_node[1]._M_parent;
    for (__position._M_current =
              (this->mMovedOutsideWatches).
              super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
        __position._M_current = __position._M_current + 1) {
      if ((__position._M_current)->first == parent) {
        std::
        vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&this->mMovedOutsideWatches,__position);
        break;
      }
    }
    if (((parent->super_Watcher).Recursive == true) && (parent->Parent == (WatcherInotify *)0x0)) {
      p_Var4 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (; plVar5 = local_58._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var4 != p_Var1;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        if (((WatcherInotify *)p_Var4[1]._M_parent != parent) &&
           (bVar2 = WatcherInotify::inParentTree((WatcherInotify *)p_Var4[1]._M_parent,parent),
           bVar2)) {
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)&local_58,
                     (value_type_conflict3 *)&p_Var4[1]._M_parent[3]._M_parent);
        }
      }
      for (; plVar5 != local_58._M_impl.super__Vector_impl_data._M_finish; plVar5 = plVar5 + 1) {
        (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])(this,*plVar5);
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_58);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->mWatchesRef)._M_h,&(parent->super_Watcher).Directory);
    std::
    _Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
    ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                        *)&this->mWatches,iVar3);
    if (parent->Parent == (WatcherInotify *)0x0) {
      iVar3 = std::
              _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
              ::find(&(this->mRealWatches)._M_t,&parent->InotifyID);
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->mRealWatches)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                            *)&this->mRealWatches,iVar3);
      }
    }
    inotify_rm_watch(this->mFD,(int)local_38);
    (*(parent->super_Watcher)._vptr_Watcher[1])(parent);
  }
  return;
}

Assistant:

void FileWatcherInotify::removeWatchLocked( WatchID watchid ) {
	WatchMap::iterator iter = mWatches.find( watchid );
	if ( iter == mWatches.end() )
		return;

	WatcherInotify* watch = iter->second;

	for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
			  mMovedOutsideWatches.begin();
		  mMovedOutsideWatches.end() != itm; ++itm ) {
		if ( itm->first == watch ) {
			mMovedOutsideWatches.erase( itm );
			break;
		}
	}

	if ( watch->Recursive && NULL == watch->Parent ) {
		WatchMap::iterator it = mWatches.begin();
		std::vector<WatchID> eraseWatches;

		for ( ; it != mWatches.end(); ++it )
			if ( it->second != watch && it->second->inParentTree( watch ) )
				eraseWatches.push_back( it->second->InotifyID );

		for ( std::vector<WatchID>::iterator eit = eraseWatches.begin(); eit != eraseWatches.end();
			  ++eit ) {
			removeWatch( *eit );
		}
	}

	mWatchesRef.erase( watch->Directory );
	mWatches.erase( iter );

	if ( NULL == watch->Parent ) {
		WatchMap::iterator eraseit = mRealWatches.find( watch->InotifyID );

		if ( eraseit != mRealWatches.end() ) {
			mRealWatches.erase( eraseit );
		}
	}

	int err = inotify_rm_watch( mFD, watchid );

	if ( err < 0 ) {
		efDEBUG( "Error removing watch %d: %s\n", watchid, strerror( errno ) );
	} else {
		efDEBUG( "Removed watch %s with id: %d\n", watch->Directory.c_str(), watchid );
	}

	efSAFE_DELETE( watch );
}